

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_kmgmt.c
# Opt level: O0

int dh_get_params(void *key,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  DH *pDVar3;
  BIGNUM *pBVar4;
  DH *in_RSI;
  DH *in_RDI;
  OSSL_PARAM *p;
  DH *dh;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint uVar5;
  OSSL_PARAM *in_stack_ffffffffffffffc0;
  DH *in_stack_ffffffffffffffc8;
  OSSL_PARAM *in_stack_ffffffffffffffd0;
  
  pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (char *)0x3305c9);
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    DH_bits((DH *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar1 = OSSL_PARAM_set_int(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffd0 = pOVar2;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pDVar3 = (DH *)OSSL_PARAM_locate((OSSL_PARAM *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                   (char *)0x330617);
  if (pDVar3 != (DH *)0x0) {
    DH_security_bits((DH *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar1 = OSSL_PARAM_set_int(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc8 = pDVar3;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pOVar2 = OSSL_PARAM_locate((OSSL_PARAM *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (char *)0x330665);
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    DH_size(in_RDI);
    iVar1 = OSSL_PARAM_set_int(pOVar2,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc0 = pOVar2;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pDVar3 = (DH *)OSSL_PARAM_locate((OSSL_PARAM *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                   (char *)0x3306b3);
  if (pDVar3 != (DH *)0x0) {
    if (*(uint *)&(pDVar3->params).p != 5) {
      return 0;
    }
    pBVar4 = (BIGNUM *)
             ossl_dh_key2buf(in_RSI,(uchar **)in_RDI,(size_t)pDVar3,
                             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    (pDVar3->params).j = pBVar4;
    if ((pDVar3->params).j == (BIGNUM *)0x0) {
      return 0;
    }
  }
  iVar1 = ossl_dh_params_todata
                    (in_stack_ffffffffffffffc8,(OSSL_PARAM_BLD *)in_stack_ffffffffffffffc0,
                     (OSSL_PARAM *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar5 = 0;
  if (iVar1 != 0) {
    iVar1 = ossl_dh_key_todata(pDVar3,(OSSL_PARAM_BLD *)in_stack_ffffffffffffffd0,
                               (OSSL_PARAM *)in_stack_ffffffffffffffc8);
    uVar5 = (uint)(iVar1 != 0) << 0x18;
  }
  return uVar5 >> 0x18;
}

Assistant:

static ossl_inline int dh_get_params(void *key, OSSL_PARAM params[])
{
    DH *dh = key;
    OSSL_PARAM *p;

    if ((p = OSSL_PARAM_locate(params, OSSL_PKEY_PARAM_BITS)) != NULL
        && !OSSL_PARAM_set_int(p, DH_bits(dh)))
        return 0;
    if ((p = OSSL_PARAM_locate(params, OSSL_PKEY_PARAM_SECURITY_BITS)) != NULL
        && !OSSL_PARAM_set_int(p, DH_security_bits(dh)))
        return 0;
    if ((p = OSSL_PARAM_locate(params, OSSL_PKEY_PARAM_MAX_SIZE)) != NULL
        && !OSSL_PARAM_set_int(p, DH_size(dh)))
        return 0;
    if ((p = OSSL_PARAM_locate(params, OSSL_PKEY_PARAM_ENCODED_PUBLIC_KEY)) != NULL) {
        if (p->data_type != OSSL_PARAM_OCTET_STRING)
            return 0;
        p->return_size = ossl_dh_key2buf(dh, (unsigned char **)&p->data,
                                         p->data_size, 0);
        if (p->return_size == 0)
            return 0;
    }

    return ossl_dh_params_todata(dh, NULL, params)
        && ossl_dh_key_todata(dh, NULL, params);
}